

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O0

void __thiscall
Assimp::COBImporter::ReadBitM_Ascii
          (COBImporter *this,Scene *param_1,LineSplitter *splitter,ChunkInfo *nfo)

{
  uint uVar1;
  LineSplitter *this_00;
  char *in;
  Logger *this_01;
  uint head;
  ChunkInfo *nfo_local;
  LineSplitter *splitter_local;
  Scene *param_1_local;
  COBImporter *this_local;
  
  if (nfo->version < 2) {
    this_00 = LineSplitter::operator++(splitter);
    in = LineSplitter::operator[](this_00,1);
    uVar1 = strtoul10(in,(char **)0x0);
    if (uVar1 != 1) {
      this_01 = DefaultLogger::get();
      Logger::warn(this_01,"Unexpected ThumbNailHdrSize, skipping this chunk");
    }
  }
  else {
    UnsupportedChunk_Ascii(this,splitter,nfo,"BitM");
  }
  return;
}

Assistant:

void COBImporter::ReadBitM_Ascii(Scene& /*out*/, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 1) {
        return UnsupportedChunk_Ascii(splitter,nfo,"BitM");
    }
/*
    "\nThumbNailHdrSize %ld"
    "\nThumbHeader: %02hx 02hx %02hx "
    "\nColorBufSize %ld"
    "\nColorBufZipSize %ld"
    "\nZippedThumbnail: %02hx 02hx %02hx "
*/

    const unsigned int head = strtoul10((++splitter)[1]);
    if (head != sizeof(Bitmap::BitmapHeader)) {
        ASSIMP_LOG_WARN("Unexpected ThumbNailHdrSize, skipping this chunk");
        return;
    }

    /*union {
        Bitmap::BitmapHeader data;
        char opaq[sizeof Bitmap::BitmapHeader()];
    };*/
//  ReadHexOctets(opaq,head,(++splitter)[1]);
}